

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionElementType::~IfcDistributionElementType
          (IfcDistributionElementType *this)

{
  void *pvVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject
                   + -0x18);
  pvVar1 = &(this->super_IfcElementType).field_0x168 + lVar2;
  *(undefined8 *)((long)pvVar1 + -0x168) = 0x807c48;
  *(undefined8 *)((long)pvVar1 + 0x28) = 0x807d10;
  *(undefined8 *)((long)pvVar1 + -0xe0) = 0x807c70;
  *(undefined8 *)((long)pvVar1 + -0xd0) = 0x807c98;
  *(undefined8 *)((long)pvVar1 + -0x78) = 0x807cc0;
  *(undefined8 *)((long)pvVar1 + -0x20) = 0x807ce8;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  IfcTypeProduct::~IfcTypeProduct
            ((IfcTypeProduct *)
             (&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0x0 +
             lVar2),&PTR_construction_vtable_24__00807b08);
  return;
}

Assistant:

IfcDistributionElementType() : Object("IfcDistributionElementType") {}